

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddReturning(Parse *pParse,ExprList *pList)

{
  sqlite3 *db_00;
  Returning *pPtr;
  undefined1 *puVar1;
  sqlite3 *db;
  Hash *pHash;
  Returning *pRet;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pParse->pNewTrigger != (Trigger *)0x0) {
    sqlite3ErrorMsg(pParse,"cannot use RETURNING in a trigger");
  }
  pParse->bReturning = '\x01';
  pPtr = (Returning *)sqlite3DbMallocZero(db_00,200);
  if (pPtr == (Returning *)0x0) {
    sqlite3ExprListDelete(db_00,pList);
  }
  else {
    (pParse->u1).pReturning = pPtr;
    pPtr->pParse = pParse;
    pPtr->pReturnEL = pList;
    sqlite3ParserAddCleanup(pParse,sqlite3DeleteReturning,pPtr);
    if (db_00->mallocFailed == '\0') {
      (pPtr->retTrig).zName = "sqlite_returning";
      (pPtr->retTrig).op = 0x96;
      (pPtr->retTrig).tr_tm = '\x02';
      (pPtr->retTrig).bReturning = '\x01';
      (pPtr->retTrig).pSchema = db_00->aDb[1].pSchema;
      (pPtr->retTrig).pTabSchema = db_00->aDb[1].pSchema;
      (pPtr->retTrig).step_list = &pPtr->retTStep;
      (pPtr->retTStep).op = 0x96;
      (pPtr->retTStep).pTrig = &pPtr->retTrig;
      (pPtr->retTStep).pExprList = pList;
      puVar1 = (undefined1 *)
               sqlite3HashInsert(&(db_00->aDb[1].pSchema)->trigHash,"sqlite_returning",
                                 &pPtr->retTrig);
      if ((Trigger *)puVar1 == &pPtr->retTrig) {
        sqlite3OomFault(db_00);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddReturning(Parse *pParse, ExprList *pList){
  Returning *pRet;
  Hash *pHash;
  sqlite3 *db = pParse->db;
  if( pParse->pNewTrigger ){
    sqlite3ErrorMsg(pParse, "cannot use RETURNING in a trigger");
  }else{
    assert( pParse->bReturning==0 );
  }
  pParse->bReturning = 1;
  pRet = sqlite3DbMallocZero(db, sizeof(*pRet));
  if( pRet==0 ){
    sqlite3ExprListDelete(db, pList);
    return;
  }
  pParse->u1.pReturning = pRet;
  pRet->pParse = pParse;
  pRet->pReturnEL = pList;
  sqlite3ParserAddCleanup(pParse,
     (void(*)(sqlite3*,void*))sqlite3DeleteReturning, pRet);
  testcase( pParse->earlyCleanup );
  if( db->mallocFailed ) return;
  pRet->retTrig.zName = RETURNING_TRIGGER_NAME;
  pRet->retTrig.op = TK_RETURNING;
  pRet->retTrig.tr_tm = TRIGGER_AFTER;
  pRet->retTrig.bReturning = 1;
  pRet->retTrig.pSchema = db->aDb[1].pSchema;
  pRet->retTrig.pTabSchema = db->aDb[1].pSchema;
  pRet->retTrig.step_list = &pRet->retTStep;
  pRet->retTStep.op = TK_RETURNING;
  pRet->retTStep.pTrig = &pRet->retTrig;
  pRet->retTStep.pExprList = pList;
  pHash = &(db->aDb[1].pSchema->trigHash);
  assert( sqlite3HashFind(pHash, RETURNING_TRIGGER_NAME)==0 || pParse->nErr );
  if( sqlite3HashInsert(pHash, RETURNING_TRIGGER_NAME, &pRet->retTrig)
          ==&pRet->retTrig ){
    sqlite3OomFault(db);
  }
}